

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

void av1_rc_postencode_update(AV1_COMP *cpi,uint64_t bytes_used)

{
  AV1_COMMON *cm;
  uint *puVar1;
  int64_t *piVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  FRAME_UPDATE_TYPE FVar5;
  FRAME_TYPE FVar6;
  AV1_PRIMARY *pAVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  
  cm = &cpi->common;
  pAVar7 = cpi->ppi;
  FVar5 = (pAVar7->gf_group).update_type[cpi->gf_frame_index];
  iVar13 = (cpi->common).quant_params.base_qindex;
  (cpi->rc).projected_frame_size = (int)bytes_used << 3;
  av1_rc_update_rate_correction_factors(cpi,0,(cpi->common).width,(cpi->common).height);
  if ((cpi->oxcf).rc_cfg.mode == AOM_CBR) {
    if ((cm->current_frame).frame_type != '\0') {
      if ((cpi->sf).hl_sf.accurate_bit_estimate != 0) {
        dVar15 = av1_convert_qindex_to_q
                           ((cpi->common).quant_params.base_qindex,
                            ((cpi->common).seq_params)->bit_depth);
        iVar8 = (int)(((double)(cpi->rc).projected_frame_size * dVar15) /
                     SQRT(((double)CONCAT44(0x45300000,(int)(cpi->rec_sse >> 0x20)) -
                          1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)cpi->rec_sse) - 4503599627370496.0)));
        iVar9 = (cpi->rc).bit_est_ratio;
        if (iVar9 != 0) {
          iVar8 = (iVar9 * 7 + iVar8) / 8;
        }
        (cpi->rc).bit_est_ratio = iVar8;
      }
      goto LAB_001f13ff;
    }
LAB_001f14b9:
    (pAVar7->p_rc).last_q[0] = iVar13;
    (pAVar7->p_rc).avg_frame_qindex[0] = (pAVar7->p_rc).avg_frame_qindex[0] * 3 + iVar13 + 2 >> 2;
    bVar14 = true;
    if ((cpi->svc).spatial_layer_id == 0) {
      uVar3 = (cpi->rc).this_frame_target;
      uVar4 = (cpi->rc).projected_frame_size;
      (cpi->rc).last_encoded_size_keyframe = uVar4;
      (cpi->rc).last_target_size_keyframe = uVar3;
    }
  }
  else {
LAB_001f13ff:
    if ((cm->current_frame).frame_type == '\0') goto LAB_001f14b9;
    if (((cpi->ppi->use_svc == 0) || ((cpi->oxcf).rc_cfg.mode != AOM_CBR)) &&
       ((cpi->rc).rtc_external_ratectrl == 0)) {
      if ((cpi->rc).is_src_frame_alt_ref == 0) {
        bVar14 = false;
        if (((cpi->refresh_frame).golden_frame != false) || (FVar5 == '\x06')) goto LAB_001f150c;
        if ((cpi->refresh_frame).alt_ref_frame == false) goto LAB_001f142b;
      }
      bVar14 = false;
    }
    else {
LAB_001f142b:
      (pAVar7->p_rc).last_q[1] = iVar13;
      (pAVar7->p_rc).avg_frame_qindex[1] = (pAVar7->p_rc).avg_frame_qindex[1] * 3 + iVar13 + 2 >> 2;
      piVar10 = &(pAVar7->p_rc).ni_frames;
      *piVar10 = *piVar10 + 1;
      dVar15 = av1_convert_qindex_to_q(iVar13,((cpi->common).seq_params)->bit_depth);
      dVar15 = dVar15 + (pAVar7->p_rc).tot_q;
      (pAVar7->p_rc).tot_q = dVar15;
      iVar9 = (pAVar7->p_rc).ni_frames;
      (pAVar7->p_rc).avg_q = dVar15 / (double)iVar9;
      iVar8 = (cpi->rc).ni_tot_qi + iVar13;
      (cpi->rc).ni_tot_qi = iVar8;
      (cpi->rc).ni_av_qi = iVar8 / iVar9;
      bVar14 = (cpi->common).current_frame.frame_type == '\0';
    }
  }
LAB_001f150c:
  piVar10 = &(pAVar7->p_rc).last_boosted_qindex;
  if (iVar13 < (pAVar7->p_rc).last_boosted_qindex) {
    *piVar10 = iVar13;
    if (!bVar14) goto LAB_001f154a;
LAB_001f152e:
    piVar10 = &(pAVar7->p_rc).last_kf_qindex;
  }
  else {
    if (bVar14) {
      *piVar10 = iVar13;
      goto LAB_001f152e;
    }
    if (((pAVar7->p_rc).constrained_gf_group != 0) ||
       ((((cpi->refresh_frame).alt_ref_frame == false && (FVar5 != '\x06')) &&
        (((cpi->refresh_frame).golden_frame != true || ((cpi->rc).is_src_frame_alt_ref != 0))))))
    goto LAB_001f154a;
  }
  *piVar10 = iVar13;
LAB_001f154a:
  update_buffer_level(cpi,(cpi->rc).projected_frame_size);
  iVar13 = (cpi->rc).avg_frame_bandwidth;
  (cpi->rc).prev_avg_frame_bandwidth = iVar13;
  iVar9 = av1_frame_scaled(cm);
  if (iVar9 != 0) {
    dVar16 = (double)(cpi->rc).this_frame_target /
             ((double)((cpi->oxcf).frm_dim_cfg.height * (cpi->oxcf).frm_dim_cfg.width) /
             (double)((cpi->common).height * (cpi->common).width));
    dVar15 = 2147483647.0;
    if (dVar16 <= 2147483647.0) {
      dVar15 = dVar16;
    }
    (cpi->rc).this_frame_target = (int)dVar15;
  }
  FVar6 = (cpi->common).current_frame.frame_type;
  lVar11 = (long)(cpi->rc).projected_frame_size;
  if (FVar6 != '\0') {
    (pAVar7->p_rc).rolling_target_bits =
         (int)((long)(pAVar7->p_rc).rolling_target_bits * 3 + (long)(cpi->rc).this_frame_target + 2U
              >> 2);
    (pAVar7->p_rc).rolling_actual_bits =
         (int)((long)(pAVar7->p_rc).rolling_actual_bits * 3 + lVar11 + 2U >> 2);
  }
  piVar2 = &(pAVar7->p_rc).total_actual_bits;
  *piVar2 = *piVar2 + lVar11;
  iVar9 = (cpi->common).show_frame;
  if (iVar9 == 0) {
    iVar13 = 0;
  }
  piVar2 = &(pAVar7->p_rc).total_target_bits;
  *piVar2 = *piVar2 + (long)iVar13;
  if (((((cpi->oxcf).gf_cfg.lag_in_frames < 3) || ((cpi->oxcf).gf_cfg.enable_auto_arf == false)) ||
      ((cpi->refresh_frame).alt_ref_frame != true)) || ((FVar6 == '\0' || (FVar6 == '\x03')))) {
    bVar12 = (cpi->refresh_frame).golden_frame;
    if (((_Bool)bVar12 == false) && ((cpi->rc).is_src_frame_alt_ref == 0)) {
      if (iVar9 != 0) {
        piVar10 = &(cpi->rc).frames_since_golden;
        *piVar10 = *piVar10 + 1;
      }
    }
    else {
      (cpi->rc).frames_since_golden = 0;
    }
    if (FVar6 == '\0') {
      (cpi->rc).frames_since_key = 0;
      (cpi->rc).frames_since_scene_change = 0;
    }
  }
  else {
    (cpi->rc).frames_since_golden = 0;
    bVar12 = (cpi->refresh_frame).golden_frame;
  }
  if ((bVar12 & 1) != 0) {
    (cpi->rc).frame_num_last_gf_refresh = (cpi->common).current_frame.frame_number;
  }
  iVar13 = (cpi->common).height;
  (cpi->rc).prev_coded_width = (cpi->common).width;
  (cpi->rc).prev_coded_height = iVar13;
  puVar1 = &(cpi->rc).frame_number_encoded;
  *puVar1 = *puVar1 + 1;
  (cpi->rc).prev_frame_is_dropped = 0;
  (cpi->rc).drop_count_consec = 0;
  return;
}

Assistant:

void av1_rc_postencode_update(AV1_COMP *cpi, uint64_t bytes_used) {
  const AV1_COMMON *const cm = &cpi->common;
  const CurrentFrame *const current_frame = &cm->current_frame;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;

  const int is_intrnl_arf =
      gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE;

  const int qindex = cm->quant_params.base_qindex;

#if RT_PASSIVE_STRATEGY
  const int frame_number = current_frame->frame_number % MAX_Q_HISTORY;
  p_rc->q_history[frame_number] = qindex;
#endif  // RT_PASSIVE_STRATEGY

  // Update rate control heuristics
  rc->projected_frame_size = (int)(bytes_used << 3);

  // Post encode loop adjustment of Q prediction.
  av1_rc_update_rate_correction_factors(cpi, 0, cm->width, cm->height);

  // Update bit estimation ratio.
  if (cpi->oxcf.rc_cfg.mode == AOM_CBR &&
      cm->current_frame.frame_type != KEY_FRAME &&
      cpi->sf.hl_sf.accurate_bit_estimate) {
    const double q = av1_convert_qindex_to_q(cm->quant_params.base_qindex,
                                             cm->seq_params->bit_depth);
    const int this_bit_est_ratio =
        (int)(rc->projected_frame_size * q / sqrt((double)cpi->rec_sse));
    cpi->rc.bit_est_ratio =
        cpi->rc.bit_est_ratio == 0
            ? this_bit_est_ratio
            : (7 * cpi->rc.bit_est_ratio + this_bit_est_ratio) / 8;
  }

  // Keep a record of last Q and ambient average Q.
  if (current_frame->frame_type == KEY_FRAME) {
    p_rc->last_q[KEY_FRAME] = qindex;
    p_rc->avg_frame_qindex[KEY_FRAME] =
        ROUND_POWER_OF_TWO(3 * p_rc->avg_frame_qindex[KEY_FRAME] + qindex, 2);
    if (cpi->svc.spatial_layer_id == 0) {
      rc->last_encoded_size_keyframe = rc->projected_frame_size;
      rc->last_target_size_keyframe = rc->this_frame_target;
    }
  } else {
    if ((cpi->ppi->use_svc && cpi->oxcf.rc_cfg.mode == AOM_CBR) ||
        cpi->rc.rtc_external_ratectrl ||
        (!rc->is_src_frame_alt_ref &&
         !(refresh_frame->golden_frame || is_intrnl_arf ||
           refresh_frame->alt_ref_frame))) {
      p_rc->last_q[INTER_FRAME] = qindex;
      p_rc->avg_frame_qindex[INTER_FRAME] = ROUND_POWER_OF_TWO(
          3 * p_rc->avg_frame_qindex[INTER_FRAME] + qindex, 2);
      p_rc->ni_frames++;
      p_rc->tot_q += av1_convert_qindex_to_q(qindex, cm->seq_params->bit_depth);
      p_rc->avg_q = p_rc->tot_q / p_rc->ni_frames;
      // Calculate the average Q for normal inter frames (not key or GFU
      // frames).
      rc->ni_tot_qi += qindex;
      rc->ni_av_qi = rc->ni_tot_qi / p_rc->ni_frames;
    }
  }
  // Keep record of last boosted (KF/GF/ARF) Q value.
  // If the current frame is coded at a lower Q then we also update it.
  // If all mbs in this group are skipped only update if the Q value is
  // better than that already stored.
  // This is used to help set quality in forced key frames to reduce popping
  if ((qindex < p_rc->last_boosted_qindex) ||
      (current_frame->frame_type == KEY_FRAME) ||
      (!p_rc->constrained_gf_group &&
       (refresh_frame->alt_ref_frame || is_intrnl_arf ||
        (refresh_frame->golden_frame && !rc->is_src_frame_alt_ref)))) {
    p_rc->last_boosted_qindex = qindex;
  }
  if (current_frame->frame_type == KEY_FRAME) p_rc->last_kf_qindex = qindex;

  update_buffer_level(cpi, rc->projected_frame_size);
  rc->prev_avg_frame_bandwidth = rc->avg_frame_bandwidth;

  // Rolling monitors of whether we are over or underspending used to help
  // regulate min and Max Q in two pass.
  if (av1_frame_scaled(cm))
    rc->this_frame_target = saturate_cast_double_to_int(
        rc->this_frame_target /
        resize_rate_factor(&cpi->oxcf.frm_dim_cfg, cm->width, cm->height));
  if (current_frame->frame_type != KEY_FRAME) {
    p_rc->rolling_target_bits = (int)ROUND_POWER_OF_TWO_64(
        (int64_t)p_rc->rolling_target_bits * 3 + rc->this_frame_target, 2);
    p_rc->rolling_actual_bits = (int)ROUND_POWER_OF_TWO_64(
        (int64_t)p_rc->rolling_actual_bits * 3 + rc->projected_frame_size, 2);
  }

  // Actual bits spent
  p_rc->total_actual_bits += rc->projected_frame_size;
  p_rc->total_target_bits += cm->show_frame ? rc->avg_frame_bandwidth : 0;

  if (is_altref_enabled(cpi->oxcf.gf_cfg.lag_in_frames,
                        cpi->oxcf.gf_cfg.enable_auto_arf) &&
      refresh_frame->alt_ref_frame &&
      (current_frame->frame_type != KEY_FRAME && !frame_is_sframe(cm)))
    // Update the alternate reference frame stats as appropriate.
    update_alt_ref_frame_stats(cpi);
  else
    // Update the Golden frame stats as appropriate.
    update_golden_frame_stats(cpi);

#if CONFIG_FPMT_TEST
  /*The variables temp_avg_frame_qindex, temp_last_q, temp_avg_q,
   * temp_last_boosted_qindex are introduced only for quality simulation
   * purpose, it retains the value previous to the parallel encode frames. The
   * variables are updated based on the update flag.
   *
   * If there exist show_existing_frames between parallel frames, then to
   * retain the temp state do not update it. */
  int show_existing_between_parallel_frames =
      (cpi->ppi->gf_group.update_type[cpi->gf_frame_index] ==
           INTNL_OVERLAY_UPDATE &&
       cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index + 1] == 2);

  if (cpi->do_frame_data_update && !show_existing_between_parallel_frames &&
      cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) {
    for (int i = 0; i < FRAME_TYPES; i++) {
      p_rc->temp_last_q[i] = p_rc->last_q[i];
    }
    p_rc->temp_avg_q = p_rc->avg_q;
    p_rc->temp_last_boosted_qindex = p_rc->last_boosted_qindex;
    p_rc->temp_total_actual_bits = p_rc->total_actual_bits;
    p_rc->temp_projected_frame_size = rc->projected_frame_size;
    for (int i = 0; i < RATE_FACTOR_LEVELS; i++)
      p_rc->temp_rate_correction_factors[i] = p_rc->rate_correction_factors[i];
  }
#endif
  if (current_frame->frame_type == KEY_FRAME) {
    rc->frames_since_key = 0;
    rc->frames_since_scene_change = 0;
  }
  if (cpi->refresh_frame.golden_frame)
    rc->frame_num_last_gf_refresh = current_frame->frame_number;
  rc->prev_coded_width = cm->width;
  rc->prev_coded_height = cm->height;
  rc->frame_number_encoded++;
  rc->prev_frame_is_dropped = 0;
  rc->drop_count_consec = 0;
}